

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O0

void __thiscall gamespace::GameScreenInputState::idle(GameScreenInputState *this)

{
  Camera *pCVar1;
  Context *pCVar2;
  double dVar3;
  GameScreenInputState *this_local;
  
  if ((this->_movementmask[0] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveUp(pCVar1,dVar3 * 10.0);
  }
  if ((this->_movementmask[1] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveDown(pCVar1,dVar3 * 10.0);
  }
  if ((this->_movementmask[2] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveLeft(pCVar1,dVar3 * 10.0);
  }
  if ((this->_movementmask[3] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveRight(pCVar1,dVar3 * 10.0);
  }
  if ((this->_movementmask[4] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveForward(pCVar1,dVar3 * 10.0);
  }
  if ((this->_movementmask[5] & 1U) != 0) {
    pCVar1 = GameScreenImpl::camera(this->_impl);
    pCVar2 = GameScreenImpl::context(this->_impl);
    dVar3 = qe::Context::deltaT(pCVar2);
    qe::Camera::moveBackward(pCVar1,dVar3 * 10.0);
  }
  return;
}

Assistant:

void GameScreenInputState::idle() {
    if(_movementmask[MOVEUP]) _impl->camera()->moveUp(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEDOWN]) _impl->camera()->moveDown(10 * _impl->context()->deltaT());
    if(_movementmask[MOVELEFT]) _impl->camera()->moveLeft(10 * _impl->context()->deltaT());
    if(_movementmask[MOVERIGHT]) _impl->camera()->moveRight(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEFORWARD]) _impl->camera()->moveForward(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEBACKWARD]) _impl->camera()->moveBackward(10 * _impl->context()->deltaT());
}